

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

Abc_Des_t * Abc_DesCreate(char *pName)

{
  Abc_Des_t *__s;
  char *pcVar1;
  st__table *psVar2;
  Vec_Ptr_t *pVVar3;
  Hop_Man_t *pHVar4;
  Abc_Des_t *p;
  char *pName_local;
  
  __s = (Abc_Des_t *)malloc(0x38);
  memset(__s,0,0x38);
  pcVar1 = Abc_UtilStrsav(pName);
  __s->pName = pcVar1;
  psVar2 = st__init_table(strcmp,st__strhash);
  __s->tModules = psVar2;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vTops = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vModules = pVVar3;
  pHVar4 = Hop_ManStart();
  __s->pManFunc = pHVar4;
  __s->pLibrary = (Abc_Des_t *)0x0;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create the library.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Des_t * Abc_DesCreate( char * pName )
{
    Abc_Des_t * p;
    p = ABC_ALLOC( Abc_Des_t, 1 );
    memset( p, 0, sizeof(Abc_Des_t) );
    p->pName    = Abc_UtilStrsav( pName );
    p->tModules = st__init_table( strcmp, st__strhash );
    p->vTops    = Vec_PtrAlloc( 100 );
    p->vModules = Vec_PtrAlloc( 100 );
    p->pManFunc = Hop_ManStart();
    p->pLibrary = NULL;
    return p;
}